

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_node(mg_session *session,mg_node **node)

{
  int iVar1;
  mg_node *buf;
  long lVar2;
  uint32_t i;
  ulong uVar3;
  uint32_t label_count;
  int64_t id;
  
  iVar1 = mg_session_check_struct_header(session,0xb3,'N');
  if (iVar1 == 0) {
    iVar1 = mg_session_read_integer(session,&id);
    if (iVar1 == 0) {
      iVar1 = mg_session_read_container_size(session,&label_count,MG_MARKERS_LIST);
      if (iVar1 == 0) {
        buf = mg_node_alloc(label_count,session->decoder_allocator);
        if (buf == (mg_node *)0x0) {
          mg_session_set_error(session,"out of memory");
          iVar1 = -3;
        }
        else {
          buf->id = id;
          buf->label_count = 0;
          for (lVar2 = 0; (ulong)label_count << 3 != lVar2; lVar2 = lVar2 + 8) {
            iVar1 = mg_session_read_string(session,(mg_string **)((long)buf->labels + lVar2));
            if (iVar1 != 0) goto LAB_00106951;
            buf->label_count = buf->label_count + 1;
          }
          iVar1 = mg_session_read_map(session,&buf->properties);
          if (iVar1 == 0) {
            *node = buf;
            iVar1 = 0;
          }
          else {
LAB_00106951:
            for (uVar3 = 0; uVar3 < buf->label_count; uVar3 = uVar3 + 1) {
              mg_string_destroy_ca(buf->labels[uVar3],session->decoder_allocator);
            }
            mg_allocator_free(session->decoder_allocator,buf);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_node(mg_session *session, mg_node **node) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 3), MG_SIGNATURE_NODE));

  int64_t id;
  MG_RETURN_IF_FAILED(mg_session_read_integer(session, &id));

  uint32_t label_count;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &label_count, MG_MARKERS_LIST));

  mg_node *tnode = mg_node_alloc(label_count, session->decoder_allocator);
  if (!tnode) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tnode->id = id;
  tnode->label_count = 0;
  for (uint32_t i = 0; i < label_count; ++i) {
    status = mg_session_read_string(session, &tnode->labels[i]);
    if (status != 0) {
      goto cleanup;
    }
    tnode->label_count++;
  }

  status = mg_session_read_map(session, &tnode->properties);
  if (status != 0) {
    goto cleanup;
  }

  *node = tnode;

  return 0;

cleanup:
  for (uint32_t i = 0; i < tnode->label_count; ++i) {
    mg_string_destroy_ca(tnode->labels[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tnode);
  return status;
}